

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O0

curl_slist * Curl_slist_append_nodup(curl_slist *list,char *data)

{
  curl_slist *pcVar1;
  curl_slist *new_item;
  curl_slist *last;
  char *data_local;
  curl_slist *list_local;
  
  list_local = (curl_slist *)(*Curl_cmalloc)(0x10);
  if (list_local == (curl_slist *)0x0) {
    list_local = (curl_slist *)0x0;
  }
  else {
    list_local->next = (curl_slist *)0x0;
    list_local->data = data;
    if (list != (curl_slist *)0x0) {
      pcVar1 = slist_get_last(list);
      pcVar1->next = list_local;
      list_local = list;
    }
  }
  return list_local;
}

Assistant:

struct curl_slist *Curl_slist_append_nodup(struct curl_slist *list, char *data)
{
  struct curl_slist     *last;
  struct curl_slist     *new_item;

  DEBUGASSERT(data);

  new_item = malloc(sizeof(struct curl_slist));
  if(!new_item)
    return NULL;

  new_item->next = NULL;
  new_item->data = data;

  /* if this is the first item, then new_item *is* the list */
  if(!list)
    return new_item;

  last = slist_get_last(list);
  last->next = new_item;
  return list;
}